

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

int __thiscall QTemporaryDir::remove(QTemporaryDir *this,char *__filename)

{
  QDebug *this_00;
  long in_FS_OFFSET;
  bool result;
  QString *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  QString *in_stack_ffffffffffffff18;
  QMessageLogger *in_stack_ffffffffffffff20;
  QDebug *this_01;
  QMessageLogger *this_02;
  QDebug *in_stack_ffffffffffffff38;
  QString *path;
  QDebug *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff68;
  byte local_81;
  QDebug local_80 [2];
  QDir *in_stack_ffffffffffffff90;
  QMessageLogger local_50;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d_ptr->success & 1U) == 0) {
    local_81 = 0;
  }
  else {
    path = &local_28;
    QTemporaryDir::path((QTemporaryDir *)in_stack_ffffffffffffff18);
    QDir::QDir((QDir *)this,path);
    local_81 = QDir::removeRecursively(in_stack_ffffffffffffff90);
    QDir::~QDir((QDir *)0x2f6cd9);
    QString::~QString((QString *)0x2f6ce6);
    if (!(bool)local_81) {
      this_02 = &local_50;
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff08);
      QMessageLogger::warning(this_02);
      this_00 = QDebug::operator<<(in_stack_ffffffffffffff38,
                                   (char *)CONCAT17(local_81,in_stack_ffffffffffffff68));
      this_01 = local_80;
      QTemporaryDir::path((QTemporaryDir *)in_stack_ffffffffffffff18);
      QDir::toNativeSeparators(in_stack_ffffffffffffff08);
      QDebug::operator<<(this_01,in_stack_ffffffffffffff18);
      QDebug::operator<<(this_00,(char *)CONCAT17(local_81,in_stack_ffffffffffffff68));
      QString::~QString((QString *)0x2f6da4);
      QString::~QString((QString *)0x2f6dae);
      QDebug::~QDebug(in_stack_ffffffffffffff58);
    }
    local_81 = local_81 & 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_81);
  }
  __stack_chk_fail();
}

Assistant:

bool QTemporaryDir::remove()
{
    if (!d_ptr->success)
        return false;
    Q_ASSERT(!path().isEmpty());
    Q_ASSERT(path() != "."_L1);

    const bool result = QDir(path()).removeRecursively();
    if (!result) {
        qWarning() << "QTemporaryDir: Unable to remove"
                   << QDir::toNativeSeparators(path())
                   << "most likely due to the presence of read-only files.";
    }
    return result;
}